

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  size_t sVar2;
  uv__io_cb p_Var3;
  long *plVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  uint *puVar8;
  cmsghdr *pcVar9;
  uint uVar10;
  uv__io_t *puVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uv_stream_t *stream;
  msghdr msg;
  int error;
  uv_buf_t local_1d0;
  uint local_1bc;
  cmsghdr *local_1b8;
  int local_1ac;
  uv_stream_t *local_1a8;
  ulong local_1a0;
  size_t local_198;
  ulong local_190;
  uint *local_188;
  msghdr local_180;
  cmsghdr local_148 [17];
  
  uVar15 = *(uint *)(w[-3].watcher_queue + 1);
  if ((0xe < uVar15) || ((0x5080U >> (uVar15 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                  ,0x509,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((*(uint *)&w[-1].cb & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                  ,0x50a,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].pending_queue + 1);
  lVar6 = *(long *)&w[-1].pevents;
  if (lVar6 != 0) {
    local_180.msg_name = (void *)CONCAT44(local_180.msg_name._4_4_,4);
    if ((uVar15 != 7) && (uVar15 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                    ,0x540,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar15 = w[1].pevents;
    if (uVar15 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                      ,0x54c,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,local_148,(socklen_t *)&local_180);
      uVar15 = -(uint)local_148[0].cmsg_len;
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,uVar15);
    }
    else {
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,uVar15);
      w[1].pevents = 0;
    }
    if (uVar15 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    iVar5 = *(int *)((long)w[-3].watcher_queue[0] + 0x20);
    if (iVar5 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                    ,0x559,"void uv__stream_connect(uv_stream_t *)");
    }
    *(int *)((long)w[-3].watcher_queue[0] + 0x20) = iVar5 + -1;
    if (((int)uVar15 < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
      uv__io_stop((uv_loop_t *)w[-3].watcher_queue[0],w,4);
      uVar15 = (uint)local_148[0].cmsg_len;
    }
    if (*(code **)(lVar6 + 0x40) != (code *)0x0) {
      (**(code **)(lVar6 + 0x40))(lVar6);
      uVar15 = (uint)local_148[0].cmsg_len;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar15) {
      return;
    }
    puVar11 = (uv__io_t *)w[1].cb;
    if (w + 1 != puVar11) {
      do {
        p_Var3 = puVar11->cb;
        *(uv__io_cb *)puVar11->pending_queue[0] = p_Var3;
        *(void **)(p_Var3 + 8) = puVar11->pending_queue[0];
        *(undefined4 *)((long)puVar11->watcher_queue + 0xc) = 0xffffff83;
        puVar11->cb = (uv__io_cb)(w[1].pending_queue + 1);
        plVar4 = (long *)w[1].watcher_queue[0];
        puVar11->pending_queue[0] = plVar4;
        *plVar4 = (long)puVar11;
        w[1].watcher_queue[0] = puVar11;
        puVar11 = (uv__io_t *)w[1].cb;
      } while (w + 1 != puVar11);
    }
    uv__write_callbacks(stream);
    return;
  }
  iVar5 = w->fd;
  if (iVar5 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                  ,0x511,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    *(uint *)&w[-1].cb = *(uint *)&w[-1].cb & 0xfffffbfe;
    uVar19 = 0;
    if (uVar15 == 7) {
      uVar19 = (ulong)(*(int *)&w[2].cb != 0);
    }
    local_188 = &w[1].events;
    uVar20 = uVar19;
    iVar5 = 0x20;
    local_1a8 = stream;
    do {
      if (((w[-1].watcher_queue[0] == (void *)0x0) || (((ulong)w[-1].cb & 0x1000) == 0)) ||
         (iVar5 == 0)) goto LAB_0011060d;
      if (w[-1].pending_queue[1] == (void *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                      ,0x46f,"void uv__read(uv_stream_t *)");
      }
      local_1d0 = uv_buf_init((char *)0x0,0);
      (*(code *)w[-1].pending_queue[1])(stream,0x10000,&local_1d0,w[-1].watcher_queue[1]);
      if ((local_1d0.base == (char *)0x0) || (local_1d0.len == 0)) {
        pvVar12 = w[-1].watcher_queue[1];
        uVar17 = 0xffffffffffffff97;
        goto LAB_0011055d;
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                      ,0x47a,"void uv__read(uv_stream_t *)");
      }
      local_1ac = iVar5 + -1;
      if ((char)uVar20 == '\0') {
        while( true ) {
          lVar6 = read(w->fd,local_1d0.base,local_1d0.len);
          if (-1 < lVar6) break;
          piVar7 = __errno_location();
          iVar5 = *piVar7;
          if (iVar5 != 4) goto LAB_00110530;
        }
      }
      else {
        local_180.msg_flags = 0;
        local_180.msg_iov = (iovec *)&local_1d0;
        local_180.msg_iovlen = 1;
        local_180.msg_name = (void *)0x0;
        local_180.msg_namelen = 0;
        local_180.msg_controllen = 0x110;
        local_180.msg_control = local_148;
        while (lVar6 = uv__recvmsg(w->fd,&local_180,0), lVar6 < 0) {
          piVar7 = __errno_location();
          iVar5 = *piVar7;
          if (iVar5 != 4) goto LAB_00110530;
        }
      }
      if (lVar6 == 0) {
        uv__stream_eof(stream,&local_1d0);
        goto LAB_0011060d;
      }
      local_198 = local_1d0.len;
      pcVar9 = (cmsghdr *)local_180.msg_control;
      local_1bc = events;
      local_190 = uVar20;
      if ((cmsghdr *)local_180.msg_control != (cmsghdr *)0x0 &&
          (0xf < local_180.msg_controllen && (char)uVar19 == '\x01')) {
        do {
          local_1b8 = pcVar9;
          if (pcVar9->cmsg_type == 1) {
            uVar20 = 0xffffffff;
            uVar15 = 0;
            do {
              uVar13 = uVar15;
              uVar18 = (int)uVar20 + 1;
              uVar20 = (ulong)uVar18;
              sVar2 = uVar20 * 4 + 0x10;
              uVar15 = uVar13 + 1;
            } while ((long)sVar2 < (long)pcVar9->cmsg_len);
            if (sVar2 != pcVar9->cmsg_len) {
              __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                            "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                            ,0x43b,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            if (uVar18 != 0) {
              uVar16 = (ulong)uVar13;
              uVar14 = 0;
              local_1a0 = uVar16;
LAB_00110357:
              uVar15 = *(uint *)((long)&pcVar9[1].cmsg_len + uVar14 * 4);
              puVar8 = local_188;
              if (*local_188 == 0xffffffff) goto LAB_001103e1;
              puVar8 = *(uint **)&w[1].fd;
              if (puVar8 != (uint *)0x0) {
                uVar13 = *puVar8;
                uVar10 = puVar8[1];
                if (uVar13 == uVar10) {
                  puVar8 = (uint *)uv__realloc(puVar8,(ulong)(uVar13 + 7) * 4 + 0xc);
                  if (puVar8 == (uint *)0x0) goto LAB_001105d2;
                  *puVar8 = uVar13 + 8;
                  *(uint **)&w[1].fd = puVar8;
                  uVar10 = puVar8[1];
                  uVar16 = local_1a0;
                  pcVar9 = local_1b8;
                }
LAB_001103d1:
                puVar8[1] = uVar10 + 1;
                puVar8 = puVar8 + (ulong)uVar10 + 2;
                goto LAB_001103e1;
              }
              puVar8 = (uint *)uv__malloc(0x28);
              if (puVar8 != (uint *)0x0) {
                puVar8[0] = 8;
                puVar8[1] = 0;
                *(uint **)&w[1].fd = puVar8;
                uVar10 = 0;
                uVar16 = local_1a0;
                pcVar9 = local_1b8;
                goto LAB_001103d1;
              }
LAB_001105d2:
              pcVar9 = local_1b8;
              if ((uint)uVar14 < uVar18) {
                do {
                  uv__close(*(int *)((long)&pcVar9[1].cmsg_len + uVar14 * 4));
                  uVar14 = uVar14 + 1;
                } while (uVar14 < uVar20);
              }
              stream = local_1a8;
              (*(code *)w[-1].watcher_queue[0])
                        (local_1a8,0xfffffffffffffff4,&local_1d0,w[-1].watcher_queue[1]);
              events = local_1bc;
              goto LAB_0011060d;
            }
          }
          else {
            fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
            pcVar9 = local_1b8;
          }
LAB_001103f0:
          pcVar9 = __cmsg_nxthdr((msghdr *)&local_180,pcVar9);
          stream = local_1a8;
        } while (pcVar9 != (cmsghdr *)0x0);
      }
      (*(code *)w[-1].watcher_queue[0])(stream,lVar6,&local_1d0,w[-1].watcher_queue[1]);
      uVar20 = local_190;
      iVar5 = local_1ac;
      events = local_1bc;
    } while ((long)local_198 <= lVar6);
    pbVar1 = (byte *)((long)&w[-1].cb + 1);
    *pbVar1 = *pbVar1 | 4;
    goto LAB_0011060d;
  }
  goto LAB_00110619;
LAB_001103e1:
  *puVar8 = uVar15;
  uVar14 = uVar14 + 1;
  if (uVar16 == uVar14) goto LAB_001103f0;
  goto LAB_00110357;
LAB_00110530:
  if (iVar5 == 0xb) {
    if (((ulong)w[-1].cb & 0x1000) != 0) {
      uv__io_start((uv_loop_t *)w[-3].watcher_queue[0],w,1);
    }
    pvVar12 = w[-1].watcher_queue[1];
    uVar17 = 0;
LAB_0011055d:
    (*(code *)w[-1].watcher_queue[0])(stream,uVar17,&local_1d0,pvVar12);
  }
  else {
    (*(code *)w[-1].watcher_queue[0])(stream,(long)-iVar5,&local_1d0,w[-1].watcher_queue[1]);
    if ((*(uint *)&w[-1].cb >> 0xc & 1) != 0) {
      *(uint *)&w[-1].cb = *(uint *)&w[-1].cb & 0xffffefff;
      uv__io_stop((uv_loop_t *)w[-3].watcher_queue[0],w,1);
      iVar5 = uv__io_active(w,4);
      if (((iVar5 == 0) && (uVar15 = *(uint *)&w[-1].cb, (uVar15 & 4) != 0)) &&
         (*(uint *)&w[-1].cb = uVar15 & 0xfffffffb, (uVar15 & 8) != 0)) {
        piVar7 = (int *)((long)w[-3].watcher_queue[0] + 8);
        *piVar7 = *piVar7 + -1;
      }
    }
  }
LAB_0011060d:
  iVar5 = w->fd;
  if (iVar5 == -1) {
    return;
  }
LAB_00110619:
  if (((events & 0x10) != 0) && (((ulong)w[-1].cb & 0x1c00) == 0x1400)) {
    local_148[0].cmsg_len = 0;
    local_148[0].cmsg_level = 0;
    local_148[0].cmsg_type = 0;
    uv__stream_eof(stream,(uv_buf_t *)local_148);
    iVar5 = w->fd;
  }
  if ((events & 0x1c) == 0) {
    return;
  }
  if (iVar5 == -1) {
    return;
  }
  uv__write(stream);
  uv__write_callbacks(stream);
  if (w + 1 != (uv__io_t *)w[1].cb) {
    return;
  }
  uv__io_stop((uv_loop_t *)w[-3].watcher_queue[0],w,4);
  if ((*(uint *)&w[-1].cb & 0x301) != 0x100) {
    return;
  }
  lVar6 = *(long *)&w[-1].fd;
  if (lVar6 == 0) {
    __assert_fail("stream->shutdown_req",
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                  ,0x2b3,"void uv__drain(uv_stream_t *)");
  }
  *(undefined8 *)&w[-1].fd = 0;
  *(uint *)&w[-1].cb = *(uint *)&w[-1].cb & 0xfffffcfe;
  iVar5 = *(int *)((long)w[-3].watcher_queue[0] + 0x20);
  if (iVar5 == 0) {
    __assert_fail("uv__has_active_reqs(stream->loop)",
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                  ,0x2b8,"void uv__drain(uv_stream_t *)");
  }
  *(int *)((long)w[-3].watcher_queue[0] + 0x20) = iVar5 + -1;
  iVar5 = shutdown(w->fd,1);
  if (iVar5 != 0) {
    piVar7 = __errno_location();
    if (*piVar7 != 0) {
      iVar5 = -*piVar7;
      goto LAB_001106f9;
    }
  }
  pbVar1 = (byte *)((long)&w[-1].cb + 1);
  *pbVar1 = *pbVar1 | 2;
  iVar5 = 0;
LAB_001106f9:
  if (*(code **)(lVar6 + 0x48) != (code *)0x0) {
    (**(code **)(lVar6 + 0x48))(lVar6,iVar5);
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}